

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmLocalUnixMakefileGenerator3::AppendDirectoryCleanCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands)

{
  undefined1 *puVar1;
  uint uVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  long *plVar5;
  cmGlobalGenerator *pcVar6;
  pointer puVar7;
  cmLocalGenerator *this_00;
  pointer pbVar8;
  cmValue cVar9;
  string *psVar10;
  ostream *poVar11;
  undefined8 in_R8;
  pointer pbVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  pointer pbVar14;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view str;
  string_view source;
  string fc;
  string local_2e8;
  string cleanfile;
  cmList cleanFiles;
  string local_270;
  string local_250;
  ofstream fout;
  
  cleanFiles.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cleanFiles.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cleanFiles.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  puVar1 = &fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)puVar1
  ;
  std::__cxx11::string::_M_construct<char_const*>((string *)&fout,"ADDITIONAL_CLEAN_FILES","");
  cVar9 = cmMakefile::GetProperty(pcVar3,(string *)&fout);
  if (fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)puVar1) {
    operator_delete(fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    fout.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  if (cVar9.Value != (string *)0x0) {
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    pcVar4 = ((cVar9.Value)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_270,pcVar4,pcVar4 + (cVar9.Value)->_M_string_length);
    pcVar3 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    cleanfile._M_dataplus._M_p = (pointer)&cleanfile.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&cleanfile,"CMAKE_BUILD_TYPE","");
    psVar10 = cmMakefile::GetSafeDefinition(pcVar3,&cleanfile);
    fc._M_string_length = 0;
    fc.field_2._M_local_buf[0] = '\0';
    fc._M_dataplus._M_p = (pointer)&fc.field_2;
    cmGeneratorExpression::Evaluate
              ((string *)&fout,&local_270,(cmLocalGenerator *)this,psVar10,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&fc);
    pbVar12 = cleanFiles.Values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar8 = cleanFiles.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (cleanFiles.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        cleanFiles.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar13 = &(cleanFiles.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar5 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (paVar13 + -1))->_M_dataplus)._M_p;
        if (paVar13 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar5) {
          operator_delete(plVar5,paVar13->_M_allocated_capacity + 1);
        }
        pbVar14 = (pointer)(paVar13 + 1);
        paVar13 = paVar13 + 2;
      } while (pbVar14 != pbVar12);
      cleanFiles.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar8;
    }
    in_R8 = 0;
    cmList::Insert(&cleanFiles.Values,
                   (const_iterator)
                   cleanFiles.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(string *)&fout,Yes,No);
    if (fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
        (_func_int **)puVar1) {
      operator_delete(fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                      fout.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fc._M_dataplus._M_p != &fc.field_2) {
      operator_delete(fc._M_dataplus._M_p,
                      CONCAT71(fc.field_2._M_allocated_capacity._1_7_,fc.field_2._M_local_buf[0]) +
                      1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cleanfile._M_dataplus._M_p != &cleanfile.field_2) {
      operator_delete(cleanfile._M_dataplus._M_p,cleanfile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
  }
  if (cleanFiles.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      cleanFiles.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pcVar6 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
    puVar7 = (pcVar6->LocalGenerators).
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pcVar6->LocalGenerators).
        super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish == puVar7) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    psVar10 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    fout.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = (psVar10->_M_dataplus)._M_p;
    fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)psVar10->_M_string_length;
    fout.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
    fout.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0x27;
    fout.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = anon_var_dwarf_2165007;
    fout.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
    views._M_len = 2;
    views._M_array = (iterator)&fout;
    cmCatViews(&cleanfile,views);
    std::ofstream::ofstream(&fout,cleanfile._M_dataplus._M_p,_S_out);
    uVar2 = *(uint *)(&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20 +
                     (long)fout.super_basic_ostream<char,_std::char_traits<char>_>.
                           _vptr_basic_ostream[-3]);
    if ((uVar2 & 5) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&fout.super_basic_ostream<char,_std::char_traits<char>_>,"file(REMOVE_RECURSE\n",
                 0x14);
      pbVar8 = cleanFiles.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (cleanFiles.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          cleanFiles.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar12 = cleanFiles.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          this_00 = (puVar7->_M_t).
                    super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                    .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
          cmsys::SystemTools::CollapseFullPath(&local_2e8,pbVar12,psVar10);
          cmOutputConverter::MaybeRelativeToCurBinDir
                    (&fc,&this_00->super_cmOutputConverter,&local_2e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    (&fout.super_basic_ostream<char,_std::char_traits<char>_>,"  ",2);
          str._M_str = (char *)0x0;
          str._M_len = (size_t)fc._M_dataplus._M_p;
          cmOutputConverter::EscapeForCMake_abi_cxx11_
                    (&local_2e8,(cmOutputConverter *)fc._M_string_length,str,(WrapQuotes)in_R8);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (&fout.super_basic_ostream<char,_std::char_traits<char>_>,
                               local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
            operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fc._M_dataplus._M_p != &fc.field_2) {
            operator_delete(fc._M_dataplus._M_p,
                            CONCAT71(fc.field_2._M_allocated_capacity._1_7_,
                                     fc.field_2._M_local_buf[0]) + 1);
          }
          pbVar12 = pbVar12 + 1;
        } while (pbVar12 != pbVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (&fout.super_basic_ostream<char,_std::char_traits<char>_>,")\n",2);
    }
    else {
      std::operator+(&fc,"Could not create ",&cleanfile);
      cmSystemTools::Error(&fc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fc._M_dataplus._M_p != &fc.field_2) {
        operator_delete(fc._M_dataplus._M_p,
                        CONCAT71(fc.field_2._M_allocated_capacity._1_7_,fc.field_2._M_local_buf[0])
                        + 1);
      }
    }
    fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = _VTT;
    *(undefined8 *)(_VTT[-3] + (long)&fout.super_basic_ostream<char,_std::char_traits<char>_>) =
         _EVP_PKEY_get_bn_param;
    std::filebuf::~filebuf
              ((filebuf *)&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
    std::ios_base::~ios_base
              ((ios_base *)&fout.super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8);
    if ((uVar2 & 5) == 0) {
      cmOutputConverter::MaybeRelativeToCurBinDir
                (&local_250,
                 &((puVar7->_M_t).
                   super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                   .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->
                  super_cmOutputConverter,&cleanfile);
      source._M_str = local_250._M_dataplus._M_p;
      source._M_len = local_250._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_2e8,(cmOutputConverter *)this,source,SHELL,false);
      fout.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)0x14;
      fout.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = anon_var_dwarf_2164e12;
      fout.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
      fout.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = local_2e8._M_string_length;
      fout.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = local_2e8._M_dataplus._M_p;
      views_00._M_len = 2;
      views_00._M_array = (iterator)&fout;
      fout.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = &local_2e8;
      cmCatViews(&fc,views_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)commands,&fc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fc._M_dataplus._M_p != &fc.field_2) {
        operator_delete(fc._M_dataplus._M_p,
                        CONCAT71(fc.field_2._M_allocated_capacity._1_7_,fc.field_2._M_local_buf[0])
                        + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cleanfile._M_dataplus._M_p != &cleanfile.field_2) {
      operator_delete(cleanfile._M_dataplus._M_p,cleanfile.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cleanFiles.Values);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendDirectoryCleanCommand(
  std::vector<std::string>& commands)
{
  cmList cleanFiles;
  // Look for additional files registered for cleaning in this directory.
  if (cmValue prop_value =
        this->Makefile->GetProperty("ADDITIONAL_CLEAN_FILES")) {
    cleanFiles.assign(cmGeneratorExpression::Evaluate(
      *prop_value, this,
      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE")));
  }
  if (cleanFiles.empty()) {
    return;
  }

  const auto& rootLG = this->GetGlobalGenerator()->GetLocalGenerators().at(0);
  std::string const& currentBinaryDir = this->GetCurrentBinaryDirectory();
  std::string cleanfile =
    cmStrCat(currentBinaryDir, "/CMakeFiles/cmake_directory_clean.cmake");
  // Write clean script
  {
    cmsys::ofstream fout(cleanfile.c_str());
    if (!fout) {
      cmSystemTools::Error("Could not create " + cleanfile);
      return;
    }
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& cfl : cleanFiles) {
      std::string fc = rootLG->MaybeRelativeToCurBinDir(
        cmSystemTools::CollapseFullPath(cfl, currentBinaryDir));
      fout << "  " << cmOutputConverter::EscapeForCMake(fc) << "\n";
    }
    fout << ")\n";
  }
  // Create command
  {
    std::string remove = cmStrCat(
      "$(CMAKE_COMMAND) -P ",
      this->ConvertToOutputFormat(rootLG->MaybeRelativeToCurBinDir(cleanfile),
                                  cmOutputConverter::SHELL));
    commands.push_back(std::move(remove));
  }
}